

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkref.c
# Opt level: O1

void * nn_chunkref_getchunk(nn_chunkref *self)

{
  int iVar1;
  void *in_RAX;
  void *pvVar2;
  size_t __n;
  byte *__src;
  void **ppvVar3;
  void *chunk;
  void *local_18;
  
  ppvVar3 = &local_18;
  pvVar2 = (void *)(ulong)(self->u).ref[0];
  if (pvVar2 == (void *)0xff) {
    (self->u).ref[0] = '\0';
    ppvVar3 = (void **)((long)&self->u + 8);
  }
  else {
    __src = (byte *)0x0;
    local_18 = in_RAX;
    iVar1 = nn_chunk_alloc((size_t)pvVar2,0,&local_18);
    if (iVar1 != 0) {
      nn_chunkref_getchunk_cold_1();
      __n = 0x10;
      if ((ulong)*__src != 0xff) {
        __n = (ulong)*__src + 1;
      }
      pvVar2 = memcpy(pvVar2,__src,__n);
      return pvVar2;
    }
    memcpy(local_18,(void *)((long)&self->u + 1),(ulong)(self->u).ref[0]);
    (self->u).ref[0] = '\0';
  }
  return *ppvVar3;
}

Assistant:

void *nn_chunkref_getchunk (struct nn_chunkref *self)
{
    int rc;
    struct nn_chunkref_chunk *ch;
    void *chunk;

    if (self->u.ref [0] == 0xff) {
        ch = (struct nn_chunkref_chunk*) self;
        self->u.ref [0] = 0;
        return ch->chunk;
    }

    rc = nn_chunk_alloc (self->u.ref [0], 0, &chunk);
    errno_assert (rc == 0);
    memcpy (chunk, &self->u.ref [1], self->u.ref [0]);
    self->u.ref [0] = 0;
    return chunk;
}